

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePart::StructOperator::Operation<duckdb::dtime_t>
               (bigint_vec *bigint_values,double_vec *double_values,dtime_t *input,idx_t idx,
               part_mask_t mask)

{
  long *plVar1;
  double *pdVar2;
  uint uVar3;
  ulong uVar4;
  _Vector_base<long_*,_std::allocator<long_*>_> local_108;
  _Vector_base<long_*,_std::allocator<long_*>_> local_f0;
  _Vector_base<long_*,_std::allocator<long_*>_> local_d8;
  _Vector_base<double_*,_std::allocator<double_*>_> local_c0;
  _Vector_base<long_*,_std::allocator<long_*>_> local_a8;
  _Vector_base<long_*,_std::allocator<long_*>_> local_90;
  _Vector_base<long_*,_std::allocator<long_*>_> local_78;
  _Vector_base<long_*,_std::allocator<long_*>_> local_60;
  _Vector_base<long_*,_std::allocator<long_*>_> local_48;
  
  if ((mask & 0x10) != 0) {
    uVar4 = input->micros % 60000000;
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_48,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar1 = HasPartValue<long*>((vector<long_*,_true> *)&local_48,MICROSECONDS);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_48);
    if (plVar1 != (long *)0x0) {
      plVar1[idx] = uVar4;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_60,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar1 = HasPartValue<long*>((vector<long_*,_true> *)&local_60,MILLISECONDS);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_60);
    uVar3 = (int)uVar4 >> 0x1f;
    if (plVar1 != (long *)0x0) {
      plVar1[idx] = (long)(int)((long)((ulong)uVar3 << 0x20 | uVar4 & 0xffffffff) / 1000);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_78,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar1 = HasPartValue<long*>((vector<long_*,_true> *)&local_78,SECOND);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_78);
    if (plVar1 != (long *)0x0) {
      plVar1[idx] = (long)(int)((long)((ulong)uVar3 << 0x20 | uVar4 & 0xffffffff) / 1000000);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_90,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar1 = HasPartValue<long*>((vector<long_*,_true> *)&local_90,MINUTE);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_90);
    if (plVar1 != (long *)0x0) {
      plVar1[idx] = (input->micros % 3600000000) / 60000000;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_a8,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar1 = HasPartValue<long*>((vector<long_*,_true> *)&local_a8,HOUR);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_a8);
    if (plVar1 != (long *)0x0) {
      plVar1[idx] = input->micros / 3600000000;
    }
  }
  if ((mask & 8) != 0) {
    ::std::vector<double_*,_std::allocator<double_*>_>::vector
              ((vector<double_*,_std::allocator<double_*>_> *)&local_c0,
               &double_values->super_vector<double_*,_std::allocator<double_*>_>);
    pdVar2 = HasPartValue<double*>((vector<double_*,_true> *)&local_c0,BEGIN_DOUBLE);
    ::std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base(&local_c0);
    if (pdVar2 != (double *)0x0) {
      pdVar2[idx] = (double)input->micros / 1000000.0;
    }
  }
  if ((mask & 0x20) != 0) {
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_d8,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar1 = HasPartValue<long*>((vector<long_*,_true> *)&local_d8,TIMEZONE);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_d8);
    if (plVar1 != (long *)0x0) {
      plVar1[idx] = 0;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_f0,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar1 = HasPartValue<long*>((vector<long_*,_true> *)&local_f0,TIMEZONE_HOUR);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_f0);
    if (plVar1 != (long *)0x0) {
      plVar1[idx] = 0;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              ((vector<long_*,_std::allocator<long_*>_> *)&local_108,
               &bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    plVar1 = HasPartValue<long*>((vector<long_*,_true> *)&local_108,TIMEZONE_MINUTE);
    ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base(&local_108);
    if (plVar1 != (long *)0x0) {
      plVar1[idx] = 0;
    }
  }
  return;
}

Assistant:

void DatePart::StructOperator::Operation(bigint_vec &bigint_values, double_vec &double_values, const dtime_t &input,
                                         const idx_t idx, const part_mask_t mask) {
	int64_t *part_data;
	if (mask & TIME) {
		const auto micros = MicrosecondsOperator::Operation<dtime_t, int64_t>(input);
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MICROSECONDS);
		if (part_data) {
			part_data[idx] = micros;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MILLISECONDS);
		if (part_data) {
			part_data[idx] = micros / Interval::MICROS_PER_MSEC;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::SECOND);
		if (part_data) {
			part_data[idx] = micros / Interval::MICROS_PER_SEC;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MINUTE);
		if (part_data) {
			part_data[idx] = MinutesOperator::Operation<dtime_t, int64_t>(input);
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::HOUR);
		if (part_data) {
			part_data[idx] = HoursOperator::Operation<dtime_t, int64_t>(input);
		}
	}

	if (mask & EPOCH) {
		auto part_data = HasPartValue(double_values, DatePartSpecifier::EPOCH);
		if (part_data) {
			part_data[idx] = EpochOperator::Operation<dtime_t, double>(input);
		}
	}

	if (mask & ZONE) {
		part_data = HasPartValue(bigint_values, DatePartSpecifier::TIMEZONE);
		if (part_data) {
			part_data[idx] = 0;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::TIMEZONE_HOUR);
		if (part_data) {
			part_data[idx] = 0;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::TIMEZONE_MINUTE);
		if (part_data) {
			part_data[idx] = 0;
		}
	}
}